

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O1

MQTTErrors
mqtt_connect(mqtt_client *client,char *client_id,char *will_topic,void *will_message,
            size_t will_message_size,char *user_name,char *password,uint8_t connect_flags,
            uint16_t keep_alive)

{
  uint8_t *puVar1;
  mqtt_queued_message *pmVar2;
  size_t sVar3;
  mqtt_queued_message *pmVar4;
  size_t sVar5;
  MQTTErrors MVar6;
  
  client->keep_alive = keep_alive;
  if (client->error == MQTT_ERROR_CONNECT_NOT_CALLED) {
    client->error = MQTT_OK;
  }
  if (client->error < 0) {
    pthread_mutex_unlock((pthread_mutex_t *)&client->mutex);
    return client->error;
  }
  sVar3 = mqtt_pack_connection_request
                    ((client->mq).curr,(client->mq).curr_sz,client_id,will_topic,will_message,
                     will_message_size,user_name,password,connect_flags,keep_alive);
  if ((long)sVar3 < 0) {
LAB_001023c6:
    MVar6 = (MQTTErrors)sVar3;
    client->error = MVar6;
    pthread_mutex_unlock((pthread_mutex_t *)&client->mutex);
  }
  else {
    if (sVar3 == 0) {
      mqtt_mq_clean(&client->mq);
      sVar3 = mqtt_pack_connection_request
                        ((client->mq).curr,(client->mq).curr_sz,client_id,will_topic,will_message,
                         will_message_size,user_name,password,connect_flags,keep_alive);
      if ((long)sVar3 < 0) goto LAB_001023c6;
      if (sVar3 == 0) {
        client->error = MQTT_ERROR_SEND_BUFFER_IS_FULL;
        pthread_mutex_unlock((pthread_mutex_t *)&client->mutex);
        return MQTT_ERROR_SEND_BUFFER_IS_FULL;
      }
    }
    puVar1 = (client->mq).curr;
    pmVar2 = (client->mq).queue_tail;
    (client->mq).queue_tail = pmVar2 + -1;
    pmVar2[-1].start = puVar1;
    pmVar2[-1].size = sVar3;
    pmVar2[-1].state = MQTT_QUEUED_UNSENT;
    pmVar4 = (mqtt_queued_message *)(puVar1 + sVar3);
    sVar5 = (long)(pmVar2 + -2) - (long)pmVar4;
    sVar3 = 0;
    if (pmVar4 <= pmVar2 + -2 && sVar5 != 0) {
      sVar3 = sVar5;
    }
    (client->mq).curr = (uint8_t *)pmVar4;
    (client->mq).curr_sz = sVar3;
    pmVar2[-1].control_type = MQTT_CONTROL_CONNECT;
    pthread_mutex_unlock((pthread_mutex_t *)&client->mutex);
    MVar6 = MQTT_OK;
  }
  return MVar6;
}

Assistant:

enum MQTTErrors mqtt_connect(struct mqtt_client *client,
                     const char* client_id,
                     const char* will_topic,
                     const void* will_message,
                     size_t will_message_size,
                     const char* user_name,
                     const char* password,
                     uint8_t connect_flags,
                     uint16_t keep_alive)
{
    ssize_t rv;
    struct mqtt_queued_message *msg;

    /* Note: Current thread already has mutex locked. */

    /* update the client's state */
    client->keep_alive = keep_alive;
    if (client->error == MQTT_ERROR_CONNECT_NOT_CALLED) {
        client->error = MQTT_OK;
    }
    
    /* try to pack the message */
    MQTT_CLIENT_TRY_PACK(rv, msg, client, 
        mqtt_pack_connection_request(
            client->mq.curr, client->mq.curr_sz,
            client_id, will_topic, will_message, 
            will_message_size,user_name, password, 
            connect_flags, keep_alive
        ), 
        1
    );
    /* save the control type of the message */
    msg->control_type = MQTT_CONTROL_CONNECT;

    MQTT_PAL_MUTEX_UNLOCK(&client->mutex);
    return MQTT_OK;
}